

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O1

void greetable_call_greet
               (Greetable *proxy,gchar *arg_recipient,GCancellable *cancellable,
               GAsyncReadyCallback callback,gpointer user_data)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  uVar1 = g_dbus_proxy_get_type();
  uVar1 = g_type_check_instance_cast(proxy,uVar1);
  uVar2 = g_variant_new("(s)",arg_recipient);
  g_dbus_proxy_call(uVar1,"Greet",uVar2,0,0xffffffff,cancellable,callback,user_data);
  return;
}

Assistant:

void
greetable_call_greet (
    Greetable *proxy,
    const gchar *arg_recipient,
    GCancellable *cancellable,
    GAsyncReadyCallback callback,
    gpointer user_data)
{
  g_dbus_proxy_call (G_DBUS_PROXY (proxy),
    "Greet",
    g_variant_new ("(s)",
                   arg_recipient),
    G_DBUS_CALL_FLAGS_NONE,
    -1,
    cancellable,
    callback,
    user_data);
}